

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

uint fmt::internal::parse_nonnegative_int<wchar_t>(wchar_t **s)

{
  uint uVar1;
  uint uVar2;
  FormatError *this;
  wchar_t *pwVar3;
  wchar_t wVar4;
  
  pwVar3 = *s;
  wVar4 = *pwVar3;
  uVar1 = 0;
  do {
    pwVar3 = pwVar3 + 1;
    uVar2 = (uVar1 * 10 + wVar4) - 0x30;
    if (uVar2 < uVar1) {
      *s = pwVar3;
      goto LAB_002a6f4f;
    }
    wVar4 = *pwVar3;
    uVar1 = uVar2;
  } while ((uint)(wVar4 + L'\xffffffd0') < 10);
  *s = pwVar3;
  if (-1 < (int)uVar2) {
    return uVar2;
  }
LAB_002a6f4f:
  this = (FormatError *)__cxa_allocate_exception(0x10);
  FormatError::FormatError(this,(CStringRef)0x2ae71d);
  __cxa_throw(this,&FormatError::typeinfo,FormatError::~FormatError);
}

Assistant:

unsigned parse_nonnegative_int(const Char *&s) {
  assert('0' <= *s && *s <= '9');
  unsigned value = 0;
  do {
    unsigned new_value = value * 10 + (*s++ - '0');
    // Check if value wrapped around.
    if (new_value < value) {
      value = (std::numeric_limits<unsigned>::max)();
      break;
    }
    value = new_value;
  } while ('0' <= *s && *s <= '9');
  // Convert to unsigned to prevent a warning.
  unsigned max_int = (std::numeric_limits<int>::max)();
  if (value > max_int)
    FMT_THROW(FormatError("number is too big"));
  return value;
}